

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<long_long,_QList<QString>_>_>::Data
          (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *this,
          Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *other,size_t reserved)

{
  long lVar1;
  bool bVar2;
  QString *pQVar3;
  longlong *plVar4;
  long in_RSI;
  Span<QHashPrivate::Node<long_long,_QList<QString>_>_> *in_RDI;
  long in_FS_OFFSET;
  R_conflict7 RVar5;
  size_t otherNSpans;
  Node<long_long,_QList<QString>_> *newNode;
  Node<long_long,_QList<QString>_> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<long_long,_QList<QString>_>_> *this_00;
  longlong *key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  longlong *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  (((QList<QString> *)((long)in_RDI->offsets + 8))->d).d = *(Data **)(in_RSI + 8);
  *(QString **)((long)in_RDI->offsets + 0x10) = (QString *)0x0;
  *(qsizetype *)((long)in_RDI->offsets + 0x18) = *(qsizetype *)(in_RSI + 0x18);
  *(undefined8 *)((long)in_RDI->offsets + 0x20) = 0;
  qMax<unsigned_long>((unsigned_long *)((long)in_RDI->offsets + 8),&local_20);
  pQVar3 = (QString *)GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  *(QString **)((long)in_RDI->offsets + 0x10) = pQVar3;
  RVar5 = allocateSpans(in_stack_ffffffffffffffb0);
  *(Span **)((long)in_RDI->offsets + 0x20) = RVar5.spans;
  plVar4 = (longlong *)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = plVar4;
  for (local_40 = (longlong *)0x0; local_40 < plVar4; local_40 = (longlong *)((long)local_40 + 1)) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar2 = Span<QHashPrivate::Node<long_long,_QList<QString>_>_>::hasNode
                        ((Span<QHashPrivate::Node<long_long,_QList<QString>_>_> *)
                         (lVar1 + (long)local_40 * 0x90),i);
      if (bVar2) {
        Span<QHashPrivate::Node<long_long,_QList<QString>_>_>::at(this_00,(size_t)in_RDI);
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = findBucket<long_long>
                             ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)RVar5.spans,
                              key);
        Bucket::insert((Bucket *)0x6fcf27);
        Node<long_long,_QList<QString>_>::Node
                  ((Node<long_long,_QList<QString>_> *)this_00,
                   (Node<long_long,_QList<QString>_> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }